

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_names.cc
# Opt level: O2

bool __thiscall
bssl::ParseGeneralName
          (bssl *this,Input input,ParseGeneralNameIPAddressType ip_address_type,
          GeneralNames *subtrees,CertErrors *errors)

{
  Input input_00;
  bool bVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *this_00;
  char *id;
  Input input_01;
  string_view str;
  string_view str_00;
  string_view str_01;
  Input mask_00;
  Input value;
  string_view s;
  CBS_ASN1_TAG tag;
  long *local_50;
  Input mask;
  Parser parser;
  
  this_00 = (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
            CONCAT44(in_register_0000000c,ip_address_type);
  if (subtrees == (GeneralNames *)0x0) {
LAB_00379a1d:
    abort();
  }
  input_01.data_.size_ = (size_t)input.data_.data_;
  input_01.data_.data_ = (uchar *)this;
  der::Parser::Parser(&parser,input_01);
  value.data_.data_ = (uchar *)0x0;
  value.data_.size_ = 0;
  bVar1 = der::Parser::ReadTagAndValue(&parser,&tag,&value);
  if (!bVar1) {
    return false;
  }
  switch(tag) {
  case 0x80000001:
    s._M_str = (char *)value.data_.data_;
    s._M_len = value.data_.size_;
    str._M_str._0_4_ = tag;
    str._M_len = (size_t)value.data_.data_;
    str._M_str._4_4_ = 0;
    bVar1 = string_util::IsAscii((string_util *)value.data_.size_,str);
    if (bVar1) {
      ::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)(this_00 + 1),&s);
      uVar2 = 2;
      break;
    }
    id = "rfc822Name is not ASCII";
    goto LAB_00379a08;
  case 0x80000002:
    s._M_str = (char *)value.data_.data_;
    s._M_len = value.data_.size_;
    str_01._M_str._0_4_ = tag;
    str_01._M_len = (size_t)value.data_.data_;
    str_01._M_str._4_4_ = 0;
    bVar1 = string_util::IsAscii((string_util *)value.data_.size_,str_01);
    if (!bVar1) {
      id = "dNSName is not ASCII";
      goto LAB_00379a08;
    }
    ::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(this_00 + 2),&s);
    uVar2 = 4;
    break;
  case 0x80000003:
  case 0x80000004:
  case 0x80000005:
switchD_0037977f_caseD_80000003:
    CreateCertErrorParams1SizeT((bssl *)&local_50,"tag",(ulong)tag);
    CertErrors::AddError
              ((CertErrors *)subtrees,"Unknown GeneralName type",
               (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> *)
               &local_50);
    if (local_50 == (long *)0x0) {
      return false;
    }
    (**(code **)(*local_50 + 8))();
    return false;
  case 0x80000006:
    s._M_str = (char *)value.data_.data_;
    s._M_len = value.data_.size_;
    str_00._M_str._0_4_ = tag;
    str_00._M_len = (size_t)value.data_.data_;
    str_00._M_str._4_4_ = 0;
    bVar1 = string_util::IsAscii((string_util *)value.data_.size_,str_00);
    if (!bVar1) {
      id = "uniformResourceIdentifier is not ASCII";
      goto LAB_00379a08;
    }
    ::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(this_00 + 6),&s);
    uVar2 = 0x40;
    break;
  case 0x80000007:
    if ((int)input.data_.size_ == 1) {
      if ((value.data_.size_ == 8) || (value.data_.size_ == 0x20)) {
        s = (string_view)Span<const_unsigned_char>::first(&value.data_,value.data_.size_ >> 1);
        mask.data_ = Span<const_unsigned_char>::subspan
                               (&value.data_,value.data_.size_ >> 1,0xffffffffffffffff);
        mask_00.data_.size_ = (uchar *)mask.data_.size_;
        mask_00.data_.data_ = mask_00.data_.size_;
        bVar1 = IsValidNetmask((bssl *)mask.data_.data_,mask_00);
        if (bVar1) {
          ::std::
          vector<std::pair<bssl::der::Input,bssl::der::Input>,std::allocator<std::pair<bssl::der::Input,bssl::der::Input>>>
          ::emplace_back<bssl::der::Input&,bssl::der::Input&>
                    ((vector<std::pair<bssl::der::Input,bssl::der::Input>,std::allocator<std::pair<bssl::der::Input,bssl::der::Input>>>
                      *)(this_00 + 8),(Input *)&s,&mask);
          goto LAB_003799f7;
        }
      }
    }
    else {
      if ((int)input.data_.size_ != 0) goto LAB_00379a1d;
      if ((value.data_.size_ == 4) || (value.data_.size_ == 0x10)) {
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                  (this_00 + 7,&value);
LAB_003799f7:
        uVar2 = 0x80;
        break;
      }
    }
    id = "Failed parsing iPAddress";
LAB_00379a08:
    CertErrors::AddError((CertErrors *)subtrees,id);
    return false;
  case 0x80000008:
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_00 + 9,&value);
    uVar2 = 0x100;
    break;
  default:
    switch(tag) {
    case 0xa0000000:
      ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back(this_00,&value);
      uVar2 = 1;
      break;
    default:
      goto switchD_0037977f_caseD_80000003;
    case 0xa0000003:
      ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                (this_00 + 3,&value);
      uVar2 = 8;
      break;
    case 0xa0000004:
      input_00.data_.size_ = value.data_.size_;
      input_00.data_.data_ = value.data_.data_;
      der::Parser::Parser((Parser *)&s,input_00);
      mask.data_ = (Span<const_unsigned_char>)ZEXT816(0);
      bVar1 = der::Parser::ReadTag((Parser *)&s,0x20000010,&mask);
      if (!bVar1) {
        return false;
      }
      bVar1 = der::Parser::HasMore(&parser);
      if (bVar1) {
        return false;
      }
      ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                (this_00 + 4,&mask);
      uVar2 = 0x10;
      break;
    case 0xa0000005:
      ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                (this_00 + 5,&value);
      uVar2 = 0x20;
    }
  }
  *(uint *)&this_00[10].super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
            _M_impl.super__Vector_impl_data._M_start =
       *(uint *)&this_00[10].super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                 ._M_impl.super__Vector_impl_data._M_start | uVar2;
  return true;
}

Assistant:

[[nodiscard]] bool ParseGeneralName(
    der::Input input,
    GeneralNames::ParseGeneralNameIPAddressType ip_address_type,
    GeneralNames *subtrees, CertErrors *errors) {
  BSSL_CHECK(errors);
  der::Parser parser(input);
  CBS_ASN1_TAG tag;
  der::Input value;
  if (!parser.ReadTagAndValue(&tag, &value)) {
    return false;
  }
  GeneralNameTypes name_type = GENERAL_NAME_NONE;
  if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    // otherName                       [0]     OtherName,
    name_type = GENERAL_NAME_OTHER_NAME;
    subtrees->other_names.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 1)) {
    // rfc822Name                      [1]     IA5String,
    name_type = GENERAL_NAME_RFC822_NAME;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kRFC822NameNotAscii);
      return false;
    }
    subtrees->rfc822_names.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 2)) {
    // dNSName                         [2]     IA5String,
    name_type = GENERAL_NAME_DNS_NAME;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kDnsNameNotAscii);
      return false;
    }
    subtrees->dns_names.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 3)) {
    // x400Address                     [3]     ORAddress,
    name_type = GENERAL_NAME_X400_ADDRESS;
    subtrees->x400_addresses.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 4)) {
    // directoryName                   [4]     Name,
    name_type = GENERAL_NAME_DIRECTORY_NAME;
    // Name is a CHOICE { rdnSequence  RDNSequence }, therefore the SEQUENCE
    // tag is explicit. Remove it, since the name matching functions expect
    // only the value portion.
    der::Parser name_parser(value);
    der::Input name_value;
    if (!name_parser.ReadTag(CBS_ASN1_SEQUENCE, &name_value) ||
        parser.HasMore()) {
      return false;
    }
    subtrees->directory_names.push_back(name_value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 5)) {
    // ediPartyName                    [5]     EDIPartyName,
    name_type = GENERAL_NAME_EDI_PARTY_NAME;
    subtrees->edi_party_names.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 6)) {
    // uniformResourceIdentifier       [6]     IA5String,
    name_type = GENERAL_NAME_UNIFORM_RESOURCE_IDENTIFIER;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kURINotAscii);
      return false;
    }
    subtrees->uniform_resource_identifiers.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 7)) {
    // iPAddress                       [7]     OCTET STRING,
    name_type = GENERAL_NAME_IP_ADDRESS;
    if (ip_address_type == GeneralNames::IP_ADDRESS_ONLY) {
      // RFC 5280 section 4.2.1.6:
      // When the subjectAltName extension contains an iPAddress, the address
      // MUST be stored in the octet string in "network byte order", as
      // specified in [RFC791].  The least significant bit (LSB) of each octet
      // is the LSB of the corresponding byte in the network address.  For IP
      // version 4, as specified in [RFC791], the octet string MUST contain
      // exactly four octets.  For IP version 6, as specified in [RFC2460],
      // the octet string MUST contain exactly sixteen octets.
      if ((value.size() != kIPv4AddressSize &&
           value.size() != kIPv6AddressSize)) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      subtrees->ip_addresses.push_back(value);
    } else {
      BSSL_CHECK(ip_address_type == GeneralNames::IP_ADDRESS_AND_NETMASK);
      // RFC 5280 section 4.2.1.10:
      // The syntax of iPAddress MUST be as described in Section 4.2.1.6 with
      // the following additions specifically for name constraints. For IPv4
      // addresses, the iPAddress field of GeneralName MUST contain eight (8)
      // octets, encoded in the style of RFC 4632 (CIDR) to represent an
      // address range [RFC4632]. For IPv6 addresses, the iPAddress field
      // MUST contain 32 octets similarly encoded. For example, a name
      // constraint for "class C" subnet 192.0.2.0 is represented as the
      // octets C0 00 02 00 FF FF FF 00, representing the CIDR notation
      // 192.0.2.0/24 (mask 255.255.255.0).
      if (value.size() != kIPv4AddressSize * 2 &&
          value.size() != kIPv6AddressSize * 2) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      der::Input addr = value.first(value.size() / 2);
      der::Input mask = value.subspan(value.size() / 2);
      if (!IsValidNetmask(mask)) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      subtrees->ip_address_ranges.emplace_back(addr, mask);
    }
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 8)) {
    // registeredID                    [8]     OBJECT IDENTIFIER }
    name_type = GENERAL_NAME_REGISTERED_ID;
    subtrees->registered_ids.push_back(value);
  } else {
    errors->AddError(kUnknownGeneralNameType,
                     CreateCertErrorParams1SizeT("tag", tag));
    return false;
  }
  BSSL_CHECK(GENERAL_NAME_NONE != name_type);
  subtrees->present_name_types |= name_type;
  return true;
}